

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests1.cpp
# Opt level: O0

void __thiscall
test::iu_ParamTest_x_iutest_x_NoParam_Test::Body(iu_ParamTest_x_iutest_x_NoParam_Test *this)

{
  AssertionHelper local_1c8;
  Fixed local_198;
  iu_ParamTest_x_iutest_x_NoParam_Test *local_10;
  iu_ParamTest_x_iutest_x_NoParam_Test *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  iutest::AssertionHelper::AssertionHelper
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_tests1.cpp"
             ,0x1e,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_1c8,&local_198);
  iutest::AssertionHelper::~AssertionHelper(&local_1c8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  return;
}

Assistant:

IUTEST_F(ParamTest, NoParam)
{
    IUTEST_SUCCEED();
}